

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_TestShell::
createTest(TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_TestShell
           *this)

{
  TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_Test *this_00;
  TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_TestShell
  *this_local;
  
  this_00 = (TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x1ae);
  TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_Test::
  TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock)
{
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");

    STRCMP_EQUAL("<testcase classname=\"groupname\" name=\"testname\" assertions=\"0\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
    STRCMP_EQUAL("</testcase>\n", outputFile->line(6));
}